

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_3,_3> *
tcu::rotationMatrixX(Matrix<float,_3,_3> *__return_storage_ptr__,float radiansX)

{
  float fVar1;
  float fVar2;
  float local_c;
  
  local_c = 1.0;
  Matrix<float,_3,_3>::Matrix(__return_storage_ptr__,&local_c);
  fVar1 = cosf(radiansX);
  fVar2 = sinf(radiansX);
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = fVar1;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = -fVar2;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = fVar2;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = fVar1;
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<float, 3, 3> rotationMatrixX (float radiansX)
{
	Matrix<float, 3, 3> mat(1.0f);
	float				c	= deFloatCos(radiansX);
	float				s	= deFloatSin(radiansX);

	mat(1, 1) = c;
	mat(1, 2) = -s;
	mat(2, 1) = s;
	mat(2, 2) = c;

	return mat;
}